

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commodore.cpp
# Opt level: O0

unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
__thiscall
Storage::Tape::Commodore::Parser::duplicate_match<Storage::Tape::Commodore::Header>
          (Parser *this,
          unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
          *first_copy,
          unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
          *second_copy)

{
  bool bVar1;
  int iVar2;
  pointer pHVar3;
  size_type sVar4;
  size_type sVar5;
  reference __s1;
  reference __s2;
  unique_ptr *in_RCX;
  unique_ptr *local_30;
  unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
  *copy_to_return;
  unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
  *second_copy_local;
  unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
  *first_copy_local;
  Parser *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)second_copy);
  if (bVar1) {
    bVar1 = std::unique_ptr::operator_cast_to_bool(in_RCX);
    if (bVar1) {
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)second_copy);
      if ((!bVar1) && (bVar1 = std::unique_ptr::operator_cast_to_bool(in_RCX), !bVar1)) {
        std::
        unique_ptr<Storage::Tape::Commodore::Header,std::default_delete<Storage::Tape::Commodore::Header>>
        ::unique_ptr<std::default_delete<Storage::Tape::Commodore::Header>,void>
                  ((unique_ptr<Storage::Tape::Commodore::Header,std::default_delete<Storage::Tape::Commodore::Header>>
                    *)this,(nullptr_t)0x0);
        return (__uniq_ptr_data<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>,_true,_true>
                )(__uniq_ptr_data<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>,_true,_true>
                  )this;
      }
      pHVar3 = std::
               unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
               ::operator->(second_copy);
      local_30 = (unique_ptr *)second_copy;
      if (((pHVar3->parity_was_valid & 1U) == 0) &&
         (pHVar3 = std::
                   unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
                   ::operator->((unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
                                 *)in_RCX), (pHVar3->parity_was_valid & 1U) != 0)) {
        local_30 = in_RCX;
      }
      pHVar3 = std::
               unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
               ::operator->((unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
                             *)local_30);
      pHVar3->duplicate_matched = true;
      pHVar3 = std::
               unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
               ::operator->(second_copy);
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pHVar3->data);
      pHVar3 = std::
               unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
               ::operator->((unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
                             *)in_RCX);
      sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pHVar3->data);
      if (sVar4 == sVar5) {
        pHVar3 = std::
                 unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
                 ::operator->(second_copy);
        __s1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&pHVar3->data,0);
        pHVar3 = std::
                 unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
                 ::operator->((unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
                               *)in_RCX);
        __s2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&pHVar3->data,0);
        pHVar3 = std::
                 unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
                 ::operator->(second_copy);
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pHVar3->data);
        iVar2 = memcmp(__s1,__s2,sVar4);
        pHVar3 = std::
                 unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
                 ::operator->((unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
                               *)local_30);
        pHVar3->duplicate_matched = (bool)((iVar2 != 0 ^ 0xffU) & 1);
      }
      else {
        pHVar3 = std::
                 unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
                 ::operator->((unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
                               *)local_30);
        pHVar3->duplicate_matched = false;
      }
      std::
      unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
      ::unique_ptr((unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
                    *)this,(unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
                            *)local_30);
    }
    else {
      std::
      unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
      ::unique_ptr((unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
                    *)this,second_copy);
    }
  }
  else {
    std::
    unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
    ::unique_ptr((unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
                  *)this,(unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
                          *)in_RCX);
  }
  return (__uniq_ptr_data<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>,_true,_true>
          )(__uniq_ptr_data<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ObjectType> Parser::duplicate_match(std::unique_ptr<ObjectType> first_copy, std::unique_ptr<ObjectType> second_copy) {
	// if only one copy was parsed successfully, return it
	if(!first_copy) return second_copy;
	if(!second_copy) return first_copy;

	// if no copies were second_copy, return nullptr
	if(!first_copy && !second_copy) return nullptr;

	// otherwise plan to return either one with a correct check digit, doing a comparison with the other
	std::unique_ptr<ObjectType> *copy_to_return = &first_copy;
	if(!first_copy->parity_was_valid && second_copy->parity_was_valid) copy_to_return = &second_copy;

	(*copy_to_return)->duplicate_matched = true;
	if(first_copy->data.size() != second_copy->data.size())
		(*copy_to_return)->duplicate_matched = false;
	else
		(*copy_to_return)->duplicate_matched = !(memcmp(&first_copy->data[0], &second_copy->data[0], first_copy->data.size()));

	return std::move(*copy_to_return);
}